

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_gen_image_perlin_noise_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int offset_x,int offset_y,
          float scale,rf_color *dst,rf_int dst_size)

{
  undefined1 auVar1 [16];
  uchar uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float frequency;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float amplitude;
  float fVar38;
  float fVar39;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (width * height * 4 <= dst_size) {
    lVar4 = (long)width;
    uVar9 = 0;
    lVar15 = 0;
    if (0 < lVar4) {
      lVar15 = lVar4;
    }
    uVar5 = 0;
    if (0 < height) {
      uVar5 = (ulong)(uint)height;
    }
    for (; uVar9 != uVar5; uVar9 = uVar9 + 1) {
      lVar6 = uVar9 * lVar4;
      for (lVar18 = 0; fVar38 = 1.0, lVar18 != lVar15; lVar18 = lVar18 + 1) {
        fVar26 = 0.0;
        fVar29 = 1.0;
        for (iVar14 = 0; iVar14 != 6; iVar14 = iVar14 + 1) {
          fVar31 = (((float)(offset_x + lVar18) * scale) / (float)width) * fVar29;
          fVar34 = (((float)(long)((long)offset_y + uVar9) * scale) / (float)height) * fVar29;
          uVar21 = (int)fVar34 - (uint)(fVar34 < (float)(int)fVar34);
          iVar24 = -(uint)(fVar31 < (float)(int)fVar31);
          iVar25 = -(uint)(fVar29 < (float)(int)fVar29);
          auVar1._4_4_ = iVar24;
          auVar1._0_4_ = iVar24;
          auVar1._8_4_ = iVar25;
          auVar1._12_4_ = iVar25;
          uVar3 = movmskpd((uint)(fVar34 < (float)(int)fVar34),auVar1);
          uVar16 = (int)fVar31 - (uVar3 & 1);
          uVar3 = (int)fVar29 - (uVar3 >> 1 & 0x7f);
          uVar12 = (ulong)(uVar21 + 1 & 0xff);
          uVar19 = (ulong)(uVar3 & 0xff);
          uVar10 = (ulong)(uVar3 + 1 & 0xff);
          fVar31 = fVar31 - (float)(int)uVar16;
          fVar34 = fVar34 - (float)(int)uVar21;
          fVar39 = ((fVar34 * 6.0 + -15.0) * fVar34 + 10.0) * fVar34 * fVar34 * fVar34;
          fVar37 = fVar29 - (float)(int)uVar3;
          fVar27 = ((fVar37 * 6.0 + -15.0) * fVar37 + 10.0) * fVar37 * fVar37 * fVar37;
          lVar13 = (ulong)"\a\t\x05"
                          [uVar19 + stb__perlin_randtab
                                    [(ulong)(uVar21 & 0xff) +
                                     (ulong)stb__perlin_randtab[(uVar16 & 0xff) + iVar14]]] * 0x10;
          fVar30 = fVar37 + -1.0;
          lVar22 = (ulong)"\a\t\x05"
                          [stb__perlin_randtab
                           [(ulong)(uVar21 & 0xff) +
                            (ulong)stb__perlin_randtab[(uVar16 & 0xff) + iVar14]] + uVar10] * 0x10;
          fVar28 = fVar34 + -1.0;
          lVar17 = (ulong)"\a\t\x05"
                          [uVar19 + stb__perlin_randtab
                                    [stb__perlin_randtab[(uVar16 & 0xff) + iVar14] + uVar12]] * 0x10
          ;
          lVar7 = (ulong)"\a\t\x05"
                         [stb__perlin_randtab
                          [stb__perlin_randtab[(uVar16 & 0xff) + iVar14] + uVar12] + uVar10] * 0x10;
          fVar36 = fVar31 + -1.0;
          lVar23 = (ulong)"\a\t\x05"
                          [uVar19 + stb__perlin_randtab
                                    [(ulong)(uVar21 & 0xff) +
                                     (ulong)stb__perlin_randtab[(uVar16 + 1 & 0xff) + iVar14]]] *
                   0x10;
          lVar8 = (ulong)"\a\t\x05"
                         [stb__perlin_randtab
                          [(ulong)(uVar21 & 0xff) +
                           (ulong)stb__perlin_randtab[(uVar16 + 1 & 0xff) + iVar14]] + uVar10] *
                  0x10;
          lVar20 = (ulong)"\a\t\x05"
                          [uVar19 + stb__perlin_randtab
                                    [uVar12 + stb__perlin_randtab[(uVar16 + 1 & 0xff) + iVar14]]] *
                   0x10;
          lVar11 = (ulong)"\a\t\x05"
                          [uVar10 + stb__perlin_randtab
                                    [uVar12 + stb__perlin_randtab[(uVar16 + 1 & 0xff) + iVar14]]] *
                   0x10;
          fVar32 = *(float *)(stb__perlin_grad_basis + lVar23 + 8) * fVar37 +
                   *(float *)(stb__perlin_grad_basis + lVar23) * fVar36 +
                   *(float *)(stb__perlin_grad_basis + lVar23 + 4) * fVar34;
          fVar33 = *(float *)(stb__perlin_grad_basis + lVar13 + 8) * fVar37 +
                   *(float *)(stb__perlin_grad_basis + lVar13) * fVar31 +
                   *(float *)(stb__perlin_grad_basis + lVar13 + 4) * fVar34;
          fVar35 = *(float *)(stb__perlin_grad_basis + lVar20 + 8) * fVar37 +
                   *(float *)(stb__perlin_grad_basis + lVar20) * fVar36 +
                   *(float *)(stb__perlin_grad_basis + lVar20 + 4) * fVar28;
          fVar37 = *(float *)(stb__perlin_grad_basis + lVar17 + 8) * fVar37 +
                   *(float *)(stb__perlin_grad_basis + lVar17) * fVar31 +
                   *(float *)(stb__perlin_grad_basis + lVar17 + 4) * fVar28;
          fVar32 = ((*(float *)(stb__perlin_grad_basis + lVar8 + 8) * fVar30 +
                    *(float *)(stb__perlin_grad_basis + lVar8) * fVar36 +
                    *(float *)(stb__perlin_grad_basis + lVar8 + 4) * fVar34) - fVar32) * fVar27 +
                   fVar32;
          fVar33 = ((*(float *)(stb__perlin_grad_basis + lVar22 + 8) * fVar30 +
                    *(float *)(stb__perlin_grad_basis + lVar22) * fVar31 +
                    *(float *)(stb__perlin_grad_basis + lVar22 + 4) * fVar34) - fVar33) * fVar27 +
                   fVar33;
          fVar33 = fVar39 * ((((*(float *)(stb__perlin_grad_basis + lVar7 + 8) * fVar30 +
                               *(float *)(stb__perlin_grad_basis + lVar7) * fVar31 +
                               *(float *)(stb__perlin_grad_basis + lVar7 + 4) * fVar28) - fVar37) *
                              fVar27 + fVar37) - fVar33) + fVar33;
          fVar26 = fVar26 + (((fVar39 * ((((*(float *)(stb__perlin_grad_basis + lVar11 + 8) * fVar30
                                           + *(float *)(stb__perlin_grad_basis + lVar11) * fVar36 +
                                             *(float *)(stb__perlin_grad_basis + lVar11 + 4) *
                                             fVar28) - fVar35) * fVar27 + fVar35) - fVar32) + fVar32
                              ) - fVar33) *
                             ((fVar31 * 6.0 + -15.0) * fVar31 + 10.0) * fVar31 * fVar31 * fVar31 +
                            fVar33) * fVar38;
          fVar29 = fVar29 + fVar29;
          fVar38 = fVar38 * 0.5;
        }
        uVar2 = (uchar)(int)((fVar26 + 1.0) * 0.5 * 255.0);
        dst[lVar6 + lVar18].r = uVar2;
        dst[lVar6 + lVar18].g = uVar2;
        dst[lVar6 + lVar18].b = uVar2;
        dst[lVar6 + lVar18].a = 0xff;
      }
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_perlin_noise_to_buffer(int width, int height, int offset_x, int offset_y, float scale, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                float nx = (float)(x + offset_x)*scale/(float)width;
                float ny = (float)(y + offset_y)*scale/(float)height;

                // Typical values to start playing with:
                //   lacunarity = ~2.0   -- spacing between successive octaves (use exactly 2.0 for wrapping output)
                //   gain       =  0.5   -- relative weighting applied to each successive octave
                //   octaves    =  6     -- number of "octaves" of noise3() to sum

                // NOTE: We need to translate the data from [-1..1] to [0..1]
                float p = (stb_perlin_fbm_noise3(nx, ny, 1.0f, 2.0f, 0.5f, 6) + 1.0f) / 2.0f;

                int intensity = (int)(p * 255.0f);
                dst[y * width + x] = (rf_color){ intensity, intensity, intensity, 255 };
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}